

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exr_interface.cpp
# Opt level: O1

bool ExrInterface::writeFrame(char *outputFile,LumaFrame *frame)

{
  uint uVar1;
  float fVar2;
  short sVar3;
  void *pvVar4;
  ulong uVar5;
  undefined8 uVar6;
  LumaException *this;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  undefined8 local_50;
  RgbaOutputFile file;
  
  if (frame->buffer != (float *)0x0) {
    uVar9 = (ulong)frame->height;
    uVar1 = frame->width;
    uVar7 = (ulong)uVar1;
    pvVar4 = operator_new__(-(ulong)(uVar9 * uVar7 >> 0x3d != 0) | uVar9 * uVar7 * 8);
    if (uVar9 != 0) {
      lVar11 = 3;
      uVar5 = 0;
      do {
        lVar8 = lVar11;
        uVar10 = uVar7;
        if (uVar1 != 0) {
          do {
            fVar2 = *(float *)((long)frame->buffer + lVar8 + -3);
            if ((fVar2 != 0.0) || (NAN(fVar2))) {
              sVar3 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar2 >> 0x17) * 2);
              if (sVar3 == 0) {
                sVar3 = half::convert((int)fVar2);
              }
              else {
                sVar3 = sVar3 + (short)(((uint)fVar2 & 0x7fffff) + 0xfff +
                                        (uint)(((uint)fVar2 >> 0xd & 1) != 0) >> 0xd);
              }
            }
            else {
              sVar3 = (short)((uint)fVar2 >> 0x10);
            }
            *(short *)((long)pvVar4 + lVar8 * 2 + -6) = sVar3;
            fVar2 = *(float *)((long)frame->buffer +
                              lVar8 + -3 + (ulong)(frame->width * frame->height) * 4);
            if ((fVar2 != 0.0) || (NAN(fVar2))) {
              sVar3 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar2 >> 0x17) * 2);
              if (sVar3 == 0) {
                sVar3 = half::convert((int)fVar2);
              }
              else {
                sVar3 = sVar3 + (short)(((uint)fVar2 & 0x7fffff) + 0xfff +
                                        (uint)(((uint)fVar2 >> 0xd & 1) != 0) >> 0xd);
              }
            }
            else {
              sVar3 = (short)((uint)fVar2 >> 0x10);
            }
            *(short *)((long)pvVar4 + lVar8 * 2 + -4) = sVar3;
            fVar2 = *(float *)((long)frame->buffer +
                              lVar8 + -3 + (ulong)(frame->height * frame->width * 2) * 4);
            if ((fVar2 != 0.0) || (NAN(fVar2))) {
              sVar3 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar2 >> 0x17) * 2);
              if (sVar3 == 0) {
                sVar3 = half::convert((int)fVar2);
              }
              else {
                sVar3 = sVar3 + (short)(((uint)fVar2 & 0x7fffff) + 0xfff +
                                        (uint)(((uint)fVar2 >> 0xd & 1) != 0) >> 0xd);
              }
            }
            else {
              sVar3 = (short)((uint)fVar2 >> 0x10);
            }
            *(short *)((long)pvVar4 + lVar8 * 2 + -2) = sVar3;
            *(undefined2 *)((long)pvVar4 + lVar8 * 2) = 0;
            lVar8 = lVar8 + 4;
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
        }
        uVar5 = uVar5 + 1;
        lVar11 = lVar11 + uVar7 * 4;
      } while (uVar5 != uVar9);
    }
    local_50 = 0;
    uVar6 = Imf_2_5::globalThreadCount();
    Imf_2_5::RgbaOutputFile::RgbaOutputFile(&file,outputFile,uVar7,uVar9,7,&local_50,0,4,uVar6);
    Imf_2_5::RgbaOutputFile::setFrameBuffer((Rgba *)&file,(ulong)pvVar4,1);
    Imf_2_5::RgbaOutputFile::writePixels((int)&file);
    Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&file);
    operator_delete__(pvVar4);
    return true;
  }
  this = (LumaException *)__cxa_allocate_exception(0x28);
  LumaException::LumaException(this,"Frame does not contain any data");
  __cxa_throw(this,&LumaException::typeinfo,LumaException::~LumaException);
}

Assistant:

bool ExrInterface::writeFrame(const char *outputFile, LumaFrame &frame)
{
    if (frame.buffer == NULL)
        throw LumaException("Frame does not contain any data");
    
    try
    {
        unsigned int w = frame.width, h = frame.height;
        Array2D<Rgba> pixels;
        pixels.resizeErase(h, w);
        for (size_t y=0; y<h; y++)
	        for (size_t x=0; x<w; x++)
	        {
	            Rgba &p = pixels[y][x];
	            p.r = frame.getChannel(0)[x+y*w];
	            p.g = frame.getChannel(1)[x+y*w];
	            p.b = frame.getChannel(2)[x+y*w];
	            p.a = 0;
	        }
        
        RgbaOutputFile file(outputFile, w, h, WRITE_RGB);
        file.setFrameBuffer(&pixels[0][0], 1, w);
        file.writePixels(h);
    }
    catch (const std::exception &e)
    {
        throw LumaException(e.what());
    }
    
    return 1;
}